

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonReader.h
# Opt level: O2

void __thiscall Json::JsonReader::JsonReader(JsonReader *this,FILE *fp)

{
  int iVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  JsonReader(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (fp != (FILE *)0x0) {
    while( true ) {
      iVar1 = fgetc((FILE *)fp);
      if ((char)iVar1 == -1) break;
      std::__cxx11::string::push_back((char)this);
    }
    this->__len = (int)(this->__JSON)._M_string_length;
  }
  return;
}

Assistant:

explicit JsonReader(FILE *fp) : JsonReader("") {
            if (fp) {
                char c;
                while ((c = fgetc(fp)) != EOF) __JSON += c;
                __len = __JSON.size();
            }
        }